

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTokenFind(Parse *pParse,RenameCtx *pCtx,void *pPtr)

{
  RenameToken *pRVar1;
  RenameToken **ppRVar2;
  RenameToken *pToken;
  RenameToken **ppRVar3;
  
  ppRVar2 = &pParse->pRename;
  do {
    ppRVar3 = ppRVar2;
    pRVar1 = *ppRVar3;
    if (pRVar1 == (RenameToken *)0x0) {
      return;
    }
    ppRVar2 = &pRVar1->pNext;
  } while (pRVar1->p != pPtr);
  *ppRVar3 = pRVar1->pNext;
  pRVar1->pNext = pCtx->pList;
  pCtx->pList = pRVar1;
  pCtx->nList = pCtx->nList + 1;
  return;
}

Assistant:

static void renameTokenFind(Parse *pParse, struct RenameCtx *pCtx, void *pPtr){
  RenameToken **pp;
  assert( pPtr!=0 );
  for(pp=&pParse->pRename; (*pp); pp=&(*pp)->pNext){
    if( (*pp)->p==pPtr ){
      RenameToken *pToken = *pp;
      *pp = pToken->pNext;
      pToken->pNext = pCtx->pList;
      pCtx->pList = pToken;
      pCtx->nList++;
      break;
    }
  }
}